

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void __thiscall
testing::internal::
UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>_>_>
::~UnorderedElementsAreMatcher
          (UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>_>_>
           *this)

{
  UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>_>_>
  *this_local;
  
  std::
  tuple<testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>_>
  ::~tuple(&this->matchers_);
  return;
}

Assistant:

explicit UnorderedElementsAreMatcher(const MatcherTuple& args)
      : matchers_(args) {}